

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Deserializer.cpp
# Opt level: O0

void __thiscall adios2::format::BP5Deserializer::~BP5Deserializer(BP5Deserializer *this,void **vtt)

{
  void *pvVar1;
  char *pcVar2;
  BP5VarRec *pBVar3;
  bool bVar4;
  reference ppuVar5;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  unsigned_long **p;
  iterator __end3;
  iterator __begin3;
  vector<unsigned_long_*,_std::allocator<unsigned_long_*>_> *__range3;
  vector<unsigned_long_*,_std::allocator<unsigned_long_*>_> *pvec;
  iterator __end2_2;
  iterator __begin2_2;
  vector<std::vector<unsigned_long_*,_std::allocator<unsigned_long_*>_>,_std::allocator<std::vector<unsigned_long_*,_std::allocator<unsigned_long_*>_>_>_>
  *__range2_2;
  vector<void_*,_std::allocator<void_*>_> **step;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::vector<void_*,_std::allocator<void_*>_>_*,_std::allocator<std::vector<void_*,_std::allocator<void_*>_>_*>_>
  *__range2_1;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::format::BP5Deserializer::BP5VarRec_*>
  *VarRec;
  iterator __end2;
  iterator __begin2;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::format::BP5Deserializer::BP5VarRec_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::format::BP5Deserializer::BP5VarRec_*>_>_>
  *__range2;
  ControlInfo *next;
  ControlInfo *tmp;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::format::BP5Deserializer::BP5VarRec_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::format::BP5Deserializer::BP5VarRec_*>_>_>
  *in_stack_fffffffffffffee8;
  BP5VarRec *in_stack_fffffffffffffef0;
  StructDefinition *in_stack_ffffffffffffff00;
  string *in_stack_ffffffffffffff38;
  IO *in_stack_ffffffffffffff40;
  __normal_iterator<unsigned_long_**,_std::vector<unsigned_long_*,_std::allocator<unsigned_long_*>_>_>
  local_b8;
  reference local_b0;
  reference local_a8;
  vector<unsigned_long_*,_std::allocator<unsigned_long_*>_> *local_a0;
  __normal_iterator<std::vector<unsigned_long_*,_std::allocator<unsigned_long_*>_>_*,_std::vector<std::vector<unsigned_long_*,_std::allocator<unsigned_long_*>_>,_std::allocator<std::vector<unsigned_long_*,_std::allocator<unsigned_long_*>_>_>_>_>
  local_98;
  undefined8 *local_90;
  reference local_88;
  vector<void_*,_std::allocator<void_*>_> **local_80;
  __normal_iterator<std::vector<void_*,_std::allocator<void_*>_>_**,_std::vector<std::vector<void_*,_std::allocator<void_*>_>_*,_std::allocator<std::vector<void_*,_std::allocator<void_*>_>_*>_>_>
  local_78;
  undefined8 *local_70;
  allocator local_61;
  string local_60 [32];
  reference local_40;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::format::BP5Deserializer::BP5VarRec_*>,_true>
  local_38;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::format::BP5Deserializer::BP5VarRec_*>,_true>
  local_30;
  undefined8 *local_28;
  void *local_20;
  void *local_18;
  
  *in_RDI = *in_RSI;
  local_18 = (void *)in_RDI[0x28];
  free_FFSContext(in_RDI[7]);
  in_RDI[0x28] = 0;
  while (local_18 != (void *)0x0) {
    local_20 = *(void **)((long)local_18 + 0x10);
    pvVar1 = *(void **)((long)local_18 + 0x18);
    if (pvVar1 != (void *)0x0) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffff00)
      ;
      operator_delete(pvVar1);
    }
    pvVar1 = *(void **)((long)local_18 + 0x20);
    if (pvVar1 != (void *)0x0) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffff00)
      ;
      operator_delete(pvVar1);
    }
    free(local_18);
    local_18 = local_20;
  }
  local_28 = in_RDI + 0xe;
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::format::BP5Deserializer::BP5VarRec_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::format::BP5Deserializer::BP5VarRec_*>_>_>
       ::begin(in_stack_fffffffffffffee8);
  local_38._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::format::BP5Deserializer::BP5VarRec_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::format::BP5Deserializer::BP5VarRec_*>_>_>
       ::end(in_stack_fffffffffffffee8);
  while (bVar4 = std::__detail::operator!=(&local_30,&local_38), bVar4) {
    local_40 = std::__detail::
               _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::format::BP5Deserializer::BP5VarRec_*>,_false,_true>
               ::operator*((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::format::BP5Deserializer::BP5VarRec_*>,_false,_true>
                            *)0xd0159d);
    pcVar2 = local_40->second->VarName;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_60,pcVar2,&local_61);
    core::IO::RemoveVariable(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    std::__cxx11::string::~string(local_60);
    std::allocator<char>::~allocator((allocator<char> *)&local_61);
    free(local_40->second->VarName);
    if (local_40->second->ExprStr != (char *)0x0) {
      free(local_40->second->ExprStr);
    }
    if (local_40->second->Operator != (char *)0x0) {
      free(local_40->second->Operator);
    }
    if ((local_40->second->Def != (StructDefinition *)0x0) &&
       (in_stack_ffffffffffffff00 = local_40->second->Def,
       in_stack_ffffffffffffff00 != (StructDefinition *)0x0)) {
      core::StructDefinition::~StructDefinition((StructDefinition *)in_stack_fffffffffffffef0);
      operator_delete(in_stack_ffffffffffffff00);
    }
    pBVar3 = local_40->second;
    if (pBVar3 != (BP5VarRec *)0x0) {
      BP5VarRec::~BP5VarRec(in_stack_fffffffffffffef0);
      operator_delete(pBVar3);
    }
    std::__detail::
    _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::format::BP5Deserializer::BP5VarRec_*>,_false,_true>
    ::operator++((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::format::BP5Deserializer::BP5VarRec_*>,_false,_true>
                  *)in_stack_fffffffffffffef0);
  }
  if ((in_RDI[0x1d] != 0) &&
     (in_stack_fffffffffffffef0 = (BP5VarRec *)in_RDI[0x1d],
     in_stack_fffffffffffffef0 != (BP5VarRec *)0x0)) {
    std::vector<void_*,_std::allocator<void_*>_>::~vector
              ((vector<void_*,_std::allocator<void_*>_> *)in_stack_ffffffffffffff00);
    operator_delete(in_stack_fffffffffffffef0);
  }
  local_70 = in_RDI + 0x21;
  local_78._M_current =
       (vector<void_*,_std::allocator<void_*>_> **)
       std::
       vector<std::vector<void_*,_std::allocator<void_*>_>_*,_std::allocator<std::vector<void_*,_std::allocator<void_*>_>_*>_>
       ::begin((vector<std::vector<void_*,_std::allocator<void_*>_>_*,_std::allocator<std::vector<void_*,_std::allocator<void_*>_>_*>_>
                *)in_stack_fffffffffffffee8);
  local_80 = (vector<void_*,_std::allocator<void_*>_> **)
             std::
             vector<std::vector<void_*,_std::allocator<void_*>_>_*,_std::allocator<std::vector<void_*,_std::allocator<void_*>_>_*>_>
             ::end((vector<std::vector<void_*,_std::allocator<void_*>_>_*,_std::allocator<std::vector<void_*,_std::allocator<void_*>_>_*>_>
                    *)in_stack_fffffffffffffee8);
  while (bVar4 = __gnu_cxx::operator!=
                           ((__normal_iterator<std::vector<void_*,_std::allocator<void_*>_>_**,_std::vector<std::vector<void_*,_std::allocator<void_*>_>_*,_std::allocator<std::vector<void_*,_std::allocator<void_*>_>_*>_>_>
                             *)in_stack_fffffffffffffef0,
                            (__normal_iterator<std::vector<void_*,_std::allocator<void_*>_>_**,_std::vector<std::vector<void_*,_std::allocator<void_*>_>_*,_std::allocator<std::vector<void_*,_std::allocator<void_*>_>_*>_>_>
                             *)in_stack_fffffffffffffee8), bVar4) {
    local_88 = __gnu_cxx::
               __normal_iterator<std::vector<void_*,_std::allocator<void_*>_>_**,_std::vector<std::vector<void_*,_std::allocator<void_*>_>_*,_std::allocator<std::vector<void_*,_std::allocator<void_*>_>_*>_>_>
               ::operator*(&local_78);
    in_stack_fffffffffffffee8 =
         (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::format::BP5Deserializer::BP5VarRec_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::format::BP5Deserializer::BP5VarRec_*>_>_>
          *)*local_88;
    if (in_stack_fffffffffffffee8 !=
        (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::format::BP5Deserializer::BP5VarRec_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::format::BP5Deserializer::BP5VarRec_*>_>_>
         *)0x0) {
      std::vector<void_*,_std::allocator<void_*>_>::~vector
                ((vector<void_*,_std::allocator<void_*>_> *)in_stack_ffffffffffffff00);
      operator_delete(in_stack_fffffffffffffee8);
    }
    __gnu_cxx::
    __normal_iterator<std::vector<void_*,_std::allocator<void_*>_>_**,_std::vector<std::vector<void_*,_std::allocator<void_*>_>_*,_std::allocator<std::vector<void_*,_std::allocator<void_*>_>_*>_>_>
    ::operator++(&local_78);
  }
  local_90 = in_RDI + 0x24;
  local_98._M_current =
       (vector<unsigned_long_*,_std::allocator<unsigned_long_*>_> *)
       std::
       vector<std::vector<unsigned_long_*,_std::allocator<unsigned_long_*>_>,_std::allocator<std::vector<unsigned_long_*,_std::allocator<unsigned_long_*>_>_>_>
       ::begin((vector<std::vector<unsigned_long_*,_std::allocator<unsigned_long_*>_>,_std::allocator<std::vector<unsigned_long_*,_std::allocator<unsigned_long_*>_>_>_>
                *)in_stack_fffffffffffffee8);
  local_a0 = (vector<unsigned_long_*,_std::allocator<unsigned_long_*>_> *)
             std::
             vector<std::vector<unsigned_long_*,_std::allocator<unsigned_long_*>_>,_std::allocator<std::vector<unsigned_long_*,_std::allocator<unsigned_long_*>_>_>_>
             ::end((vector<std::vector<unsigned_long_*,_std::allocator<unsigned_long_*>_>,_std::allocator<std::vector<unsigned_long_*,_std::allocator<unsigned_long_*>_>_>_>
                    *)in_stack_fffffffffffffee8);
  while (bVar4 = __gnu_cxx::operator!=
                           ((__normal_iterator<std::vector<unsigned_long_*,_std::allocator<unsigned_long_*>_>_*,_std::vector<std::vector<unsigned_long_*,_std::allocator<unsigned_long_*>_>,_std::allocator<std::vector<unsigned_long_*,_std::allocator<unsigned_long_*>_>_>_>_>
                             *)in_stack_fffffffffffffef0,
                            (__normal_iterator<std::vector<unsigned_long_*,_std::allocator<unsigned_long_*>_>_*,_std::vector<std::vector<unsigned_long_*,_std::allocator<unsigned_long_*>_>,_std::allocator<std::vector<unsigned_long_*,_std::allocator<unsigned_long_*>_>_>_>_>
                             *)in_stack_fffffffffffffee8), bVar4) {
    local_b0 = __gnu_cxx::
               __normal_iterator<std::vector<unsigned_long_*,_std::allocator<unsigned_long_*>_>_*,_std::vector<std::vector<unsigned_long_*,_std::allocator<unsigned_long_*>_>,_std::allocator<std::vector<unsigned_long_*,_std::allocator<unsigned_long_*>_>_>_>_>
               ::operator*(&local_98);
    local_a8 = local_b0;
    local_b8._M_current =
         (unsigned_long **)
         std::vector<unsigned_long_*,_std::allocator<unsigned_long_*>_>::begin
                   ((vector<unsigned_long_*,_std::allocator<unsigned_long_*>_> *)
                    in_stack_fffffffffffffee8);
    std::vector<unsigned_long_*,_std::allocator<unsigned_long_*>_>::end
              ((vector<unsigned_long_*,_std::allocator<unsigned_long_*>_> *)
               in_stack_fffffffffffffee8);
    while (bVar4 = __gnu_cxx::operator!=
                             ((__normal_iterator<unsigned_long_**,_std::vector<unsigned_long_*,_std::allocator<unsigned_long_*>_>_>
                               *)in_stack_fffffffffffffef0,
                              (__normal_iterator<unsigned_long_**,_std::vector<unsigned_long_*,_std::allocator<unsigned_long_*>_>_>
                               *)in_stack_fffffffffffffee8), bVar4) {
      ppuVar5 = __gnu_cxx::
                __normal_iterator<unsigned_long_**,_std::vector<unsigned_long_*,_std::allocator<unsigned_long_*>_>_>
                ::operator*(&local_b8);
      if (*ppuVar5 != (unsigned_long *)0x0) {
        free(*ppuVar5);
      }
      __gnu_cxx::
      __normal_iterator<unsigned_long_**,_std::vector<unsigned_long_*,_std::allocator<unsigned_long_*>_>_>
      ::operator++(&local_b8);
    }
    __gnu_cxx::
    __normal_iterator<std::vector<unsigned_long_*,_std::allocator<unsigned_long_*>_>_*,_std::vector<std::vector<unsigned_long_*,_std::allocator<unsigned_long_*>_>,_std::allocator<std::vector<unsigned_long_*,_std::allocator<unsigned_long_*>_>_>_>_>
    ::operator++(&local_98);
  }
  std::
  vector<std::vector<unsigned_long_*,_std::allocator<unsigned_long_*>_>,_std::allocator<std::vector<unsigned_long_*,_std::allocator<unsigned_long_*>_>_>_>
  ::~vector((vector<std::vector<unsigned_long_*,_std::allocator<unsigned_long_*>_>,_std::allocator<std::vector<unsigned_long_*,_std::allocator<unsigned_long_*>_>_>_>
             *)in_stack_ffffffffffffff00);
  std::
  vector<std::vector<void_*,_std::allocator<void_*>_>_*,_std::allocator<std::vector<void_*,_std::allocator<void_*>_>_*>_>
  ::~vector((vector<std::vector<void_*,_std::allocator<void_*>_>_*,_std::allocator<std::vector<void_*,_std::allocator<void_*>_>_*>_>
             *)in_stack_ffffffffffffff00);
  std::
  vector<std::vector<adios2::format::BP5Deserializer::ControlInfo_*,_std::allocator<adios2::format::BP5Deserializer::ControlInfo_*>_>,_std::allocator<std::vector<adios2::format::BP5Deserializer::ControlInfo_*,_std::allocator<adios2::format::BP5Deserializer::ControlInfo_*>_>_>_>
  ::~vector((vector<std::vector<adios2::format::BP5Deserializer::ControlInfo_*,_std::allocator<adios2::format::BP5Deserializer::ControlInfo_*>_>,_std::allocator<std::vector<adios2::format::BP5Deserializer::ControlInfo_*,_std::allocator<adios2::format::BP5Deserializer::ControlInfo_*>_>_>_>
             *)in_stack_ffffffffffffff00);
  std::
  unordered_map<void_*,_adios2::format::BP5Deserializer::BP5VarRec_*,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_adios2::format::BP5Deserializer::BP5VarRec_*>_>_>
  ::~unordered_map((unordered_map<void_*,_adios2::format::BP5Deserializer::BP5VarRec_*,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_adios2::format::BP5Deserializer::BP5VarRec_*>_>_>
                    *)0xd01920);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::format::BP5Deserializer::BP5VarRec_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::format::BP5Deserializer::BP5VarRec_*>_>_>
  ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::format::BP5Deserializer::BP5VarRec_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::format::BP5Deserializer::BP5VarRec_*>_>_>
                    *)0xd0192e);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffff00);
  std::
  vector<adios2::format::BP5Deserializer::BP5ArrayRequest,_std::allocator<adios2::format::BP5Deserializer::BP5ArrayRequest>_>
  ::~vector((vector<adios2::format::BP5Deserializer::BP5ArrayRequest,_std::allocator<adios2::format::BP5Deserializer::BP5ArrayRequest>_>
             *)in_stack_ffffffffffffff00);
  return;
}

Assistant:

BP5Deserializer::~BP5Deserializer()
{
    struct ControlInfo *tmp = ControlBlocks;
    free_FFSContext(ReaderFFSContext);
    ControlBlocks = NULL;
    while (tmp)
    {
        struct ControlInfo *next = tmp->Next;
        delete tmp->MetaFieldOffset;
        delete tmp->CIVarIndex;
        free(tmp);
        tmp = next;
    }
    for (auto &VarRec : VarByName)
    {
        /* remove any variables that we've created from our IO */
        m_Engine->m_IO.RemoveVariable(VarRec.second->VarName);
#ifdef ADIOS2_HAVE_DERIVED_VARIABLE
        m_Engine->m_IO.RemoveDerivedVariable(VarRec.second->VarName);
#endif

        free(VarRec.second->VarName);
        if (VarRec.second->ExprStr)
            free(VarRec.second->ExprStr);
        if (VarRec.second->Operator)
            free(VarRec.second->Operator);
        if (VarRec.second->Def)
            delete VarRec.second->Def;
        delete VarRec.second;
    }
    if (m_FreeableMBA)
    {
        delete m_FreeableMBA;
    }
    for (auto &step : MetadataBaseArray)
    {
        delete step;
    }
    for (auto &pvec : JoinedDimArray)
    {
        for (auto &p : pvec)
        {
            if (p)
            {
                free(p);
            }
        }
    }
}